

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O0

void __thiscall
sznet::detail::FixedBuffer<4000000>::append(FixedBuffer<4000000> *this,char *buf,size_t len)

{
  unsigned_long uVar1;
  int local_24;
  size_t local_20;
  size_t len_local;
  char *buf_local;
  FixedBuffer<4000000> *this_local;
  
  local_20 = len;
  len_local = (size_t)buf;
  buf_local = this->m_data;
  local_24 = avail(this);
  uVar1 = implicit_cast<unsigned_long,int>(&local_24);
  if (local_20 < uVar1) {
    memcpy(this->m_cur,(void *)len_local,local_20);
    this->m_cur = this->m_cur + local_20;
  }
  return;
}

Assistant:

void append(const char* buf, size_t len)
	{
		if ((implicit_cast<size_t>(avail()) > len))
		{
			memcpy(m_cur, buf, len);
			m_cur += len;
		}
	}